

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O0

void __thiscall xercesc_4_0::XMLUri::setPort(XMLUri *this,int newPort)

{
  XMLCh *pXVar1;
  MalformedURLException *pMVar2;
  XMLCh local_128 [4];
  XMLCh value1_1 [65];
  XMLCh local_98 [4];
  XMLCh value1 [65];
  int newPort_local;
  XMLUri *this_local;
  
  value1._124_4_ = newPort;
  unique0x100001a5 = this;
  if ((newPort < 0) || (0xffff < newPort)) {
    if (newPort != -1) {
      XMLString::binToText(newPort,local_128,0x40,10,this->fMemoryManager);
      pMVar2 = (MalformedURLException *)__cxa_allocate_exception(0x30);
      MalformedURLException::MalformedURLException
                (pMVar2,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
                 ,0x4d5,XMLNUM_URI_PortNo_Invalid,local_128,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
                 this->fMemoryManager);
      __cxa_throw(pMVar2,&MalformedURLException::typeinfo,
                  MalformedURLException::~MalformedURLException);
    }
  }
  else {
    pXVar1 = getHost(this);
    if (pXVar1 == (XMLCh *)0x0) {
      XMLString::binToText(value1._124_4_,local_98,0x40,10,this->fMemoryManager);
      pMVar2 = (MalformedURLException *)__cxa_allocate_exception(0x30);
      MalformedURLException::MalformedURLException
                (pMVar2,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
                 ,0x4cb,XMLNUM_URI_NullHost,(XMLCh *)errMsg_PORT,local_98,(XMLCh *)0x0,(XMLCh *)0x0,
                 this->fMemoryManager);
      __cxa_throw(pMVar2,&MalformedURLException::typeinfo,
                  MalformedURLException::~MalformedURLException);
    }
  }
  this->fPort = value1._124_4_;
  return;
}

Assistant:

void XMLUri::setPort(int newPort)
{
    if (newPort >= 0 && newPort <= 65535)
    {
        if (!getHost())
        {
            XMLCh value1[BUF_LEN+1];
            XMLString::binToText(newPort, value1, BUF_LEN, 10, fMemoryManager);
            ThrowXMLwithMemMgr2(MalformedURLException
                    , XMLExcepts::XMLNUM_URI_NullHost
                    , errMsg_PORT
                    , value1
                    , fMemoryManager);
        }
    }
    else if (newPort != -1)
    {
        XMLCh value1[BUF_LEN+1];
        XMLString::binToText(newPort, value1, BUF_LEN, 10, fMemoryManager);
        ThrowXMLwithMemMgr1(MalformedURLException
                , XMLExcepts::XMLNUM_URI_PortNo_Invalid
                , value1
                , fMemoryManager);
    }

    fPort = newPort;
}